

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

void __thiscall toml::Value::Value(Value *this,Value *v)

{
  Value *v_local;
  Value *this_local;
  
  this->type_ = v->type_;
  switch(v->type_) {
  case NULL_TYPE:
    this->field_1 = v->field_1;
    break;
  case BOOL_TYPE:
    (this->field_1).bool_ = (bool)((v->field_1).bool_ & 1);
    break;
  case INT_TYPE:
    this->field_1 = v->field_1;
    break;
  case DOUBLE_TYPE:
    this->field_1 = v->field_1;
    break;
  case STRING_TYPE:
    this->field_1 = v->field_1;
    break;
  case TIME_TYPE:
    this->field_1 = v->field_1;
    break;
  case ARRAY_TYPE:
    this->field_1 = v->field_1;
    break;
  case TABLE_TYPE:
    this->field_1 = v->field_1;
    break;
  default:
    this->type_ = NULL_TYPE;
    (this->field_1).null_ = (void *)0x0;
  }
  v->type_ = NULL_TYPE;
  (v->field_1).null_ = (void *)0x0;
  return;
}

Assistant:

inline Value::Value(Value&& v) noexcept :
    type_(v.type_)
{
    switch (v.type_) {
    case NULL_TYPE: null_ = v.null_; break;
    case BOOL_TYPE: bool_ = v.bool_; break;
    case INT_TYPE: int_ = v.int_; break;
    case DOUBLE_TYPE: double_ = v.double_; break;
    case STRING_TYPE: string_ = v.string_; break;
    case TIME_TYPE: time_ = v.time_; break;
    case ARRAY_TYPE: array_ = v.array_; break;
    case TABLE_TYPE: table_ = v.table_; break;
    default:
        assert(false);
        type_ = NULL_TYPE;
        null_ = nullptr;
    }

    v.type_ = NULL_TYPE;
    v.null_ = nullptr;
}